

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * google::protobuf::anon_unknown_1::ToJsonName(string *__return_storage_ptr__,string *input)

{
  size_type sVar1;
  pointer pcVar2;
  string *psVar3;
  ulong unaff_RBP;
  size_type sVar4;
  bool bVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar3 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar1 = input->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (input->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      bVar5 = pcVar2[sVar4] == '_';
      unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),bVar5);
      if (!bVar5) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      sVar4 = sVar4 + 1;
      psVar3 = (string *)(unaff_RBP & 0xffffffff);
    } while (sVar1 != sVar4);
  }
  return psVar3;
}

Assistant:

std::string ToJsonName(const std::string& input) {
  bool capitalize_next = false;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  return result;
}